

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

int_fast64_t
absl::time_internal::cctz::anon_unknown_0::TransOffset
          (bool leap_year,int jan1_weekday,PosixTransition *pt)

{
  DateFormat DVar1;
  anon_union_8_3_4e90bb4b_for_Date_1 aVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  DVar1 = (pt->date).fmt;
  if (DVar1 == M) {
    lVar6 = (long)(pt->date).field_1.m.week;
    lVar5 = (long)*(short *)((anonymous_namespace)::kMonthOffsets +
                            ((ulong)(lVar6 == 5) + (long)(pt->date).field_1.m.month) * 2 +
                            (ulong)leap_year * 0x1c);
    lVar3 = (jan1_weekday + lVar5) % 7;
    lVar4 = (long)(pt->date).field_1.m.weekday;
    if (lVar6 == 5) {
      lVar3 = lVar3 - lVar4;
      aVar2 = (anon_union_8_3_4e90bb4b_for_Date_1)(~(lVar3 + ((lVar3 + 6) / 7) * -7 + 6U) + lVar5);
    }
    else {
      lVar4 = lVar4 - lVar3;
      aVar2 = (anon_union_8_3_4e90bb4b_for_Date_1)
              (lVar4 + ((lVar4 + 7) / 7) * -7 + lVar6 * 7 + lVar5);
    }
  }
  else if (DVar1 == N) {
    aVar2 = (pt->date).field_1;
  }
  else if (DVar1 == J) {
    aVar2 = (pt->date).field_1;
    aVar2 = (anon_union_8_3_4e90bb4b_for_Date_1)
            ((long)aVar2 - (ulong)(!leap_year || (long)aVar2 < 0x3c));
  }
  else {
    aVar2 = (anon_union_8_3_4e90bb4b_for_Date_1)0x0;
  }
  return (long)aVar2 * 0x15180 + (pt->time).offset;
}

Assistant:

std::int_fast64_t TransOffset(bool leap_year, int jan1_weekday,
                              const PosixTransition& pt) {
  std::int_fast64_t days = 0;
  switch (pt.date.fmt) {
    case PosixTransition::J: {
      days = pt.date.j.day;
      if (!leap_year || days < kMonthOffsets[1][3]) days -= 1;
      break;
    }
    case PosixTransition::N: {
      days = pt.date.n.day;
      break;
    }
    case PosixTransition::M: {
      const bool last_week = (pt.date.m.week == 5);
      days = kMonthOffsets[leap_year][pt.date.m.month + last_week];
      const std::int_fast64_t weekday = (jan1_weekday + days) % 7;
      if (last_week) {
        days -= (weekday + 7 - 1 - pt.date.m.weekday) % 7 + 1;
      } else {
        days += (pt.date.m.weekday + 7 - weekday) % 7;
        days += (pt.date.m.week - 1) * 7;
      }
      break;
    }
  }
  return (days * kSecsPerDay) + pt.time.offset;
}